

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

ON_Font * ON_Font::GetManagedFontFromFontDescription(wchar_t *font_description)

{
  bool bVar1;
  ON_Font *this;
  ON_Font font_characteristics;
  ON_Font local_d0;
  
  this = &local_d0;
  ON_Font(this);
  bVar1 = SetFromFontDescription(this,font_description,(wchar_t *)0x0);
  if (bVar1) {
    if (local_d0.m_runtime_serial_number == 0) {
      this = ON_ManagedFonts::GetFromFontCharacteristics(&ON_ManagedFonts::List,&local_d0,true);
    }
  }
  else {
    this = (ON_Font *)0x0;
  }
  ~ON_Font(&local_d0);
  return this;
}

Assistant:

const ON_Font* ON_Font::GetManagedFontFromFontDescription(
  const wchar_t* font_description
  )
{
  ON_Font font_characteristics;
  if ( false == font_characteristics.SetFromFontDescription(font_description) )
    return nullptr;
  return font_characteristics.ManagedFont();
}